

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmGetPropertyCommand::HandleCacheMode(cmGetPropertyCommand *this)

{
  size_type sVar1;
  cmState *pcVar2;
  char *pcVar3;
  allocator local_39;
  string local_38;
  
  sVar1 = (this->Name)._M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::string((string *)&local_38,"not given name for CACHE scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    pcVar2 = cmMakefile::GetState((this->super_cmCommand).Makefile);
    pcVar3 = cmState::GetCacheEntryValue(pcVar2,&this->Name);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar2 = cmMakefile::GetState((this->super_cmCommand).Makefile);
      pcVar3 = cmState::GetCacheEntryProperty(pcVar2,&this->Name,&this->PropertyName);
    }
    StoreResult(this,pcVar3);
  }
  return sVar1 != 0;
}

Assistant:

bool cmGetPropertyCommand::HandleCacheMode()
{
  if(this->Name.empty())
    {
    this->SetError("not given name for CACHE scope.");
    return false;
    }

  const char* value = 0;
  if(this->Makefile->GetState()->GetCacheEntryValue(this->Name))
    {
    value = this->Makefile->GetState()
                ->GetCacheEntryProperty(this->Name, this->PropertyName);
    }
  this->StoreResult(value);
  return true;
}